

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O1

KUINT16 __thiscall KDIS::DATA_TYPE::Mine::GetLength(Mine *this)

{
  KBOOL KVar1;
  KBOOL KVar2;
  _Rb_tree_node_base *p_Var3;
  KUINT16 KVar4;
  int iVar6;
  int iVar5;
  
  KVar1 = MinefieldDataFilter::IsGroundBurialDepthOffset(&this->super_MinefieldDataFilter);
  KVar2 = MinefieldDataFilter::IsWaterBurialDepthOffset(&this->super_MinefieldDataFilter);
  iVar5 = (uint)KVar1 * 4 + 0x12;
  if (!KVar2) {
    iVar5 = (uint)KVar1 * 4 + 0xe;
  }
  KVar1 = MinefieldDataFilter::IsSnowBurialDepthOffset(&this->super_MinefieldDataFilter);
  iVar6 = iVar5 + 4;
  if (!KVar1) {
    iVar6 = iVar5;
  }
  KVar1 = MinefieldDataFilter::IsMineOrientation(&this->super_MinefieldDataFilter);
  iVar5 = iVar6 + 0xc;
  if (!KVar1) {
    iVar5 = iVar6;
  }
  KVar1 = MinefieldDataFilter::IsThermalContrast(&this->super_MinefieldDataFilter);
  iVar6 = iVar5 + 4;
  if (!KVar1) {
    iVar6 = iVar5;
  }
  KVar1 = MinefieldDataFilter::IsReflectance(&this->super_MinefieldDataFilter);
  iVar5 = iVar6 + 4;
  if (!KVar1) {
    iVar5 = iVar6;
  }
  KVar1 = MinefieldDataFilter::IsMineEmplacementAge(&this->super_MinefieldDataFilter);
  iVar6 = iVar5 + 8;
  if (!KVar1) {
    iVar6 = iVar5;
  }
  KVar1 = MinefieldDataFilter::IsFusing(&this->super_MinefieldDataFilter);
  iVar5 = iVar6 + 2;
  if (!KVar1) {
    iVar5 = iVar6;
  }
  KVar1 = MinefieldDataFilter::IsScalarDetectionCoefficient(&this->super_MinefieldDataFilter);
  iVar6 = 0;
  if (KVar1) {
    iVar6 = *(int *)&(this->m_vui8SDC).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
            *(int *)&(this->m_vui8SDC).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  KVar1 = MinefieldDataFilter::IsPaintScheme(&this->super_MinefieldDataFilter);
  iVar5 = (uint)KVar1 + iVar6 + iVar5;
  KVar4 = (KUINT16)iVar5;
  KVar1 = MinefieldDataFilter::IsTripDetonationWire(&this->super_MinefieldDataFilter);
  if (KVar1) {
    iVar5 = iVar5 + 1;
    for (p_Var3 = (this->m_mvVertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        KVar4 = (KUINT16)iVar5,
        (_Rb_tree_header *)p_Var3 != &(this->m_mvVertices)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      iVar5 = iVar5 + ((uint)(*(int *)&p_Var3[1]._M_left - *(int *)&p_Var3[1]._M_parent) >> 3) * 4;
    }
  }
  return KVar4;
}

Assistant:

KUINT16 Mine::GetLength() const
{
    KUINT16 ui16Len = 14; // Min Size

    if( IsGroundBurialDepthOffset() )       ui16Len += 4;
    if( IsWaterBurialDepthOffset() )        ui16Len += 4;
    if( IsSnowBurialDepthOffset() )         ui16Len += 4;
    if( IsMineOrientation() )               ui16Len += m_Ori.EULER_ANGLES_SIZE;
    if( IsThermalContrast() )               ui16Len += 4;
    if( IsReflectance() )                   ui16Len += 4;
    if( IsMineEmplacementAge() )            ui16Len += m_MET.CLOCK_TIME_SIZE;
    if( IsFusing() )                        ui16Len += m_MF.MINE_FUSING_SIZE;
    if( IsScalarDetectionCoefficient() )    ui16Len += 1 * m_vui8SDC.size();
    if( IsPaintScheme() )                   ui16Len += m_MPS.MINE_PAINT_SCHEME_SIZE;
    if( IsTripDetonationWire() )
    {
        ++ui16Len;
        map< KUINT16, vector<Vector> >::const_iterator citrM = m_mvVertices.begin();
        map< KUINT16, vector<Vector> >::const_iterator citrMEnd = m_mvVertices.end();
        for( ; citrM != citrMEnd; ++citrM )
        {
            ui16Len += citrM->second.size() * Vector::VECTOR_SIZE;
        }
    }

    return ui16Len;
}